

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

void __thiscall
ON_BinaryArchive::SetStorageDeviceError(ON_BinaryArchive *this,uint storage_device_error)

{
  uint *puVar1;
  ON_3dmTableStatusLink *pOVar2;
  
  if (storage_device_error != 0) {
    this->m_critical_error_count = this->m_critical_error_count + 1;
    pOVar2 = this->m_3dm_table_status_list;
    if ((pOVar2 != (ON_3dmTableStatusLink *)0x0) &&
       (this->m_3dm_active_table == (pOVar2->m_table_status).m_table_type)) {
      puVar1 = &(pOVar2->m_table_status).m_critical_error_count;
      *puVar1 = *puVar1 + 1;
    }
    if (this->m_storage_device_error == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x250,"","Damaged file and / or buggy code. Please investigate.");
      this->m_storage_device_error = storage_device_error;
    }
  }
  return;
}

Assistant:

void ON_BinaryArchive::SetStorageDeviceError(
  unsigned int storage_device_error
  )
{
  if (0 != storage_device_error)
  {
    Internal_ReportCriticalError();

    // A critical error terminates the read/write.
    // The first one sets the code and subsequent attempts to modify
    // the code fail.
    if (0 == m_storage_device_error)
    {
      ON_ERROR("Damaged file and / or buggy code. Please investigate.");
      m_storage_device_error = storage_device_error;
    }
  }
}